

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<bool>::Clear(RepeatedField<bool> *this)

{
  ulong uVar1;
  bool is_soo;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  if ((uVar1 & 4) != 0) {
    internal::LongSooRep::elements((LongSooRep *)this);
  }
  is_soo = (uVar1 & 4) == 0;
  internal::SooRep::size(&this->soo_rep_,is_soo);
  ExchangeCurrentSize(this,is_soo,0);
  return;
}

Assistant:

inline void RepeatedField<Element>::Clear() {
  const bool is_soo = this->is_soo();
  Element* elem = unsafe_elements(is_soo);
  Destroy(elem, elem + size(is_soo));
  ExchangeCurrentSize(is_soo, 0);
}